

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataDevice.cpp
# Opt level: O3

void remote_wiring::FirmataDevice::firmwareVersionCallback
               (void *context_,size_t sv_major_,size_t sv_minor_,char *firmware_)

{
  size_t sVar1;
  char *__dest;
  
  *(size_t *)((long)context_ + 0x100) = sv_major_;
  *(size_t *)((long)context_ + 0x108) = sv_minor_;
  *(undefined8 *)((long)context_ + 0x110) = 0;
  sVar1 = strlen(firmware_);
  __dest = (char *)operator_new__(sVar1);
  *(char **)((long)context_ + 0xf8) = __dest;
  strcpy(__dest,firmware_);
  (**(code **)((long)context_ + 0x2b8))(*(undefined8 *)((long)context_ + 0x18));
  return;
}

Assistant:

void
FirmataDevice::firmwareVersionCallback (
    void * context_,
    size_t sv_major_,
    size_t sv_minor_,
    const char * firmware_
) {
    FirmataDevice * device = static_cast<FirmataDevice *>(context_);
    device->_firmware_semantic_version = SemVer(sv_major_, sv_minor_, 0);

    // Duplicate description
    device->_firmware_name = new char[::strlen(firmware_)];
    ::strcpy(device->_firmware_name, firmware_);

    device->_uponAttach(device->_attach_context);
}